

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

int ws_init(nni_ws **wsp)

{
  nni_ws *arg;
  int iVar1;
  
  arg = (nni_ws *)nni_zalloc(0xb28);
  if (arg == (nni_ws *)0x0) {
    iVar1 = 2;
  }
  else {
    nni_mtx_init(&arg->mtx);
    iVar1 = 0;
    nni_list_init_offset(&arg->rxq,0);
    nni_list_init_offset(&arg->txq,0);
    nni_aio_list_init(&arg->sendq);
    nni_aio_list_init(&arg->recvq);
    nni_aio_init(&arg->closeaio,ws_close_cb,arg);
    nni_aio_init(&arg->txaio,ws_write_cb,arg);
    nni_aio_init(&arg->rxaio,ws_read_cb,arg);
    nni_aio_init(&arg->httpaio,ws_http_cb,arg);
    nni_aio_init(&arg->connaio,ws_conn_cb,arg);
    nni_aio_set_timeout(&arg->closeaio,100);
    nni_aio_set_timeout(&arg->httpaio,2000);
    (arg->ops).s_close = ws_str_close;
    (arg->ops).s_free = ws_str_free;
    (arg->ops).s_stop = ws_stop;
    (arg->ops).s_send = ws_str_send;
    (arg->ops).s_recv = ws_str_recv;
    (arg->ops).s_get = ws_str_get;
    arg->fragsize = 0x100000;
    *wsp = arg;
  }
  return iVar1;
}

Assistant:

static int
ws_init(nni_ws **wsp)
{
	nni_ws *ws;

	if ((ws = NNI_ALLOC_STRUCT(ws)) == NULL) {
		return (NNG_ENOMEM);
	}
	nni_mtx_init(&ws->mtx);
	NNI_LIST_INIT(&ws->rxq, ws_frame, node);
	NNI_LIST_INIT(&ws->txq, ws_frame, node);
	nni_aio_list_init(&ws->sendq);
	nni_aio_list_init(&ws->recvq);

	nni_aio_init(&ws->closeaio, ws_close_cb, ws);
	nni_aio_init(&ws->txaio, ws_write_cb, ws);
	nni_aio_init(&ws->rxaio, ws_read_cb, ws);
	nni_aio_init(&ws->httpaio, ws_http_cb, ws);
	nni_aio_init(&ws->connaio, ws_conn_cb, ws);

	nni_aio_set_timeout(&ws->closeaio, 100);
	nni_aio_set_timeout(&ws->httpaio, 2000);

	ws->ops.s_close = ws_str_close;
	ws->ops.s_free  = ws_str_free;
	ws->ops.s_stop  = ws_stop;
	ws->ops.s_send  = ws_str_send;
	ws->ops.s_recv  = ws_str_recv;
	ws->ops.s_get   = ws_str_get;

	ws->fragsize = 1 << 20; // we won't send a frame larger than this
	*wsp         = ws;
	return (0);
}